

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_zlib_inflate_and_verify
              (uchar *pin,size_t sin,uint16_t *zdebug_table,uchar *pout,size_t sout)

{
  uint16_t *codes;
  uint16_t *table;
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  uchar uVar4;
  ushort uVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  uchar *codes_00;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ushort *puVar16;
  uint uVar17;
  byte *pbVar18;
  uint *puVar19;
  uint uVar20;
  uint16_t *puVar21;
  uint uVar22;
  uint uVar23;
  uint16_t *puVar24;
  uchar *__s;
  ulong uVar25;
  long lVar26;
  int local_90;
  undefined8 uStack_68;
  uchar codebits [19];
  int local_3c;
  ulong local_38;
  
  puVar1 = pin + sin;
  puVar2 = pout + sout;
  __s = pout;
  if (4 < (long)sin) {
    codes = zdebug_table + 0x93c;
    table = zdebug_table + 0x400;
    unique0x100006cf = zdebug_table;
    do {
      bVar9 = (byte)*(uint *)pin;
      if (((((char)bVar9 < '\0') || ((bVar9 & 0xf) != 8)) ||
          ((*(byte *)((long)pin + 1) & 0x20) != 0)) ||
         (0x842 < (ushort)(CONCAT11(bVar9,*(byte *)((long)pin + 1)) * 0x7bdf))) goto LAB_0012c17c;
      puVar7 = (uint *)((long)pin + 2);
      if (((ulong)puVar7 & 3) == 0) {
        uVar20 = 0;
        local_38 = 0;
      }
      else {
        uVar20 = 0;
        local_38 = 0;
        pbVar18 = (byte *)((long)pin + 3);
        do {
          local_38 = local_38 | (ulong)(byte)*puVar7 << ((byte)uVar20 & 0x3f);
          uVar20 = uVar20 + 8;
          puVar7 = (uint *)((long)puVar7 + 1);
          uVar25 = (ulong)pbVar18 & 3;
          pbVar18 = pbVar18 + 1;
        } while (uVar25 != 0);
      }
      do {
        puVar19 = puVar7;
        uVar25 = local_38;
        if (uVar20 < 0xf) {
          if ((long)puVar1 - (long)puVar7 < 4) goto LAB_0012c17c;
          uVar25 = local_38 | (ulong)*puVar7 << ((byte)uVar20 & 0x3f);
          uVar20 = uVar20 | 0x20;
          puVar19 = puVar7 + 1;
        }
        local_38 = uVar25 >> 3;
        uVar15 = uVar20 - 3;
        local_3c = 0;
        iVar12 = (int)puVar2;
        switch((uint)(uVar25 >> 1) & 3) {
        case 0:
          uVar8 = (ulong)(uVar20 - 0xb >> 3);
          puVar16 = (ushort *)(~uVar8 + (long)puVar19);
          if ((long)puVar1 - (long)puVar16 < 4) {
            return 0;
          }
          uVar5 = *puVar16;
          if ((puVar16[1] ^ uVar5) != 0xffff) {
            return 0;
          }
          puVar16 = puVar16 + 2;
          if ((uint)((int)puVar1 - (int)puVar16) < (uint)uVar5) {
            return 0;
          }
          if ((uint)(iVar12 - (int)__s) < (uint)uVar5) {
            return 0;
          }
          uVar14 = (ulong)uVar5;
          memcpy(__s,puVar16,uVar14);
          __s = __s + uVar14;
          puVar7 = (uint *)((long)puVar16 + uVar14);
          zdebug_table = stack0xffffffffffffffb0;
          if (((ulong)puVar7 & 3) == 0) {
            local_38 = 0;
            uVar20 = 0;
          }
          else {
            uVar20 = 0;
            local_38 = 0;
            pbVar18 = (byte *)((long)puVar19 + (uVar14 - uVar8) + 4);
            do {
              local_38 = local_38 | (ulong)(byte)*puVar7 << ((byte)uVar20 & 0x3f);
              uVar20 = uVar20 + 8;
              puVar7 = (uint *)((long)puVar7 + 1);
              uVar8 = (ulong)pbVar18 & 3;
              pbVar18 = pbVar18 + 1;
            } while (uVar8 != 0);
          }
          goto LAB_0012bac1;
        case 1:
          puVar21 = elf_zlib_default_dist_table;
          puVar24 = elf_zlib_default_table;
          break;
        case 2:
          if (uVar15 < 0xf) {
            if ((long)puVar1 - (long)puVar19 < 4) {
              return 0;
            }
            local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
            uVar15 = uVar15 | 0x20;
            puVar19 = puVar19 + 1;
          }
          uVar20 = (uint)local_38 & 0x1f;
          if (0x1d < uVar20) {
            return 0;
          }
          uVar22 = (uint)(local_38 >> 5) & 0x1f;
          if (0x1d < uVar22) {
            return 0;
          }
          uVar8 = local_38 >> 0xe;
          uVar15 = uVar15 - 0xe;
          codebits[0] = '\0';
          codebits[1] = '\0';
          codebits[2] = '\0';
          codebits[3] = '\0';
          codebits[4] = '\0';
          codebits[5] = '\0';
          codebits[6] = '\0';
          codebits[7] = '\0';
          if (uVar15 < 0xf) {
            if ((long)puVar1 - (long)puVar19 < 4) {
              return 0;
            }
            uVar8 = uVar8 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
            uVar15 = uVar15 | 0x20;
            puVar19 = puVar19 + 1;
          }
          uVar17 = (uint)local_38 >> 10 & 0xf;
          codebits[8] = (byte)uVar8 & 7;
          codebits[9] = (byte)((uVar8 & 0xffffffff) >> 3) & 7;
          codebits[10] = (byte)(uVar8 >> 6) & 7;
          uStack_68 = uVar8 >> 9 & 7;
          uVar14 = uVar8 >> 0xc;
          if (uVar17 == 0) {
LAB_0012baee:
            uVar15 = uVar15 - 0xc;
            local_38 = uVar14;
          }
          else {
            codebits[0] = (byte)uVar14 & 7;
            local_38 = uVar8 >> 0xf;
            uVar15 = uVar15 - 0xf;
            if (uVar17 != 1) {
              if (uVar15 < 0xf) {
                if ((long)puVar1 - (long)puVar19 < 4) {
                  return 0;
                }
                local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
                uVar15 = uVar15 | 0x20;
                puVar19 = puVar19 + 1;
              }
              uStack_68 = CONCAT17((char)local_38,(undefined7)uStack_68) & 0x7ffffffffffffff;
              uVar8 = local_38 >> 3;
              if (uVar17 == 2) {
LAB_0012baaa:
                uVar15 = uVar15 - 3;
                local_38 = uVar8;
              }
              else {
                codebits[1] = (byte)uVar8 & 7;
                uVar8 = local_38 >> 6;
                if (uVar17 == 3) {
LAB_0012bae5:
                  uVar15 = uVar15 - 6;
                  local_38 = uVar8;
                }
                else {
                  uStack_68 = CONCAT17(uStack_68._7_1_,CONCAT16((char)uVar8,(undefined6)uStack_68))
                              & 0xff07ffffffffffff;
                  uVar8 = local_38 >> 9;
                  if (uVar17 == 4) {
LAB_0012bb09:
                    uVar15 = uVar15 - 9;
                    local_38 = uVar8;
                  }
                  else {
                    codebits[2] = (byte)uVar8 & 7;
                    uVar14 = local_38 >> 0xc;
                    if (uVar17 == 5) goto LAB_0012baee;
                    uStack_68 = CONCAT26(uStack_68._6_2_,
                                         CONCAT15((char)uVar14,(undefined5)uStack_68)) &
                                0xffff07ffffffffff;
                    local_38 = local_38 >> 0xf;
                    uVar15 = uVar15 - 0xf;
                    if (uVar17 != 6) {
                      if (uVar15 < 0xf) {
                        if ((long)puVar1 - (long)puVar19 < 4) {
                          return 0;
                        }
                        local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
                        uVar15 = uVar15 | 0x20;
                        puVar19 = puVar19 + 1;
                      }
                      codebits[3] = (byte)local_38 & 7;
                      uVar8 = local_38 >> 3;
                      if (uVar17 == 7) goto LAB_0012baaa;
                      uStack_68 = CONCAT35(uStack_68._5_3_,CONCAT14((char)uVar8,(int)uStack_68)) &
                                  0xffffff07ffffffff;
                      uVar8 = local_38 >> 6;
                      if (uVar17 == 8) goto LAB_0012bae5;
                      codebits[4] = (byte)uVar8 & 7;
                      uVar8 = local_38 >> 9;
                      if (uVar17 == 9) goto LAB_0012bb09;
                      uStack_68 = CONCAT44(uStack_68._4_4_,
                                           CONCAT13((char)uVar8,(undefined3)uStack_68)) &
                                  0xffffffff07ffffff;
                      uVar14 = local_38 >> 0xc;
                      if (uVar17 == 10) goto LAB_0012baee;
                      codebits[5] = (byte)uVar14 & 7;
                      local_38 = local_38 >> 0xf;
                      uVar15 = uVar15 - 0xf;
                      if (uVar17 != 0xb) {
                        if (uVar15 < 0xf) {
                          if ((long)puVar1 - (long)puVar19 < 4) {
                            return 0;
                          }
                          local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
                          uVar15 = uVar15 | 0x20;
                          puVar19 = puVar19 + 1;
                        }
                        uStack_68 = CONCAT53(uStack_68._3_5_,
                                             CONCAT12((char)local_38,(undefined2)uStack_68)) &
                                    0xffffffffff07ffff;
                        uVar8 = local_38 >> 3;
                        if (uVar17 == 0xc) goto LAB_0012baaa;
                        codebits[6] = (byte)uVar8 & 7;
                        uVar8 = local_38 >> 6;
                        if (uVar17 == 0xd) goto LAB_0012bae5;
                        uStack_68 = CONCAT62(uStack_68._2_6_,CONCAT11((char)uVar8,(uchar)uStack_68))
                                    & 0xffffffffffff07ff;
                        uVar8 = local_38 >> 9;
                        if (uVar17 == 0xe) goto LAB_0012bb09;
                        codebits[7] = (byte)uVar8 & 7;
                        local_38 = local_38 >> 0xc;
                        uVar15 = uVar15 - 0xc;
                      }
                    }
                  }
                }
              }
            }
          }
          iVar6 = elf_zlib_inflate_table((uchar *)&uStack_68,0x13,zdebug_table,zdebug_table);
          if (iVar6 == 0) {
            return 0;
          }
          uVar14 = (ulong)(uVar20 + 0x101);
          codes_00 = (uchar *)((long)stack0xffffffffffffffb0 + uVar14 + 0x1278);
          uVar8 = (ulong)(uVar22 + 1);
          lVar3 = uVar14 + 0x1278 + uVar8;
          iVar6 = (int)stack0xffffffffffffffb0 + (int)lVar3;
          lVar26 = 0x1278;
          puVar24 = codes;
          puVar21 = stack0xffffffffffffffb0;
          do {
            if (uVar15 < 0xf) {
              if ((long)puVar1 - (long)puVar19 < 4) {
                return 0;
              }
              local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
              uVar15 = uVar15 | 0x20;
              puVar19 = puVar19 + 1;
            }
            uVar5 = puVar21[local_38 & 0xff];
            if ((uVar5 >> 0xc & 1) != 0) {
              return 0;
            }
            iVar13 = (uVar5 >> 9 & 7) + 1;
            local_38 = local_38 >> (sbyte)iVar13;
            uVar15 = uVar15 - iVar13;
            uVar11 = uVar5 & 0x1ff;
            if (uVar11 < 0x10) {
              lVar26 = lVar26 + 1;
              *(uchar *)puVar24 = (uchar)uVar5;
            }
            else {
              uVar20 = (uint)local_38;
              iVar13 = (int)puVar24;
              if (uVar11 == 0x12) {
                uVar20 = (uVar20 & 0x7f) + 0xb;
                if ((uint)(iVar6 - iVar13) < uVar20) {
                  return 0;
                }
                uVar15 = uVar15 - 7;
                local_38 = local_38 >> 7;
                memset(puVar24,0,(ulong)uVar20);
                lVar26 = lVar26 + (ulong)uVar20;
                puVar21 = stack0xffffffffffffffb0;
              }
              else {
                if (uVar11 == 0x11) {
                  if ((uint)(iVar6 - iVar13) < (uVar20 & 7) + 3) {
                    return 0;
                  }
                  switch(uVar20 & 7) {
                  case 7:
                    lVar26 = lVar26 + 1;
                    *(uchar *)puVar24 = '\0';
                  case 6:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 5:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 4:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 3:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 2:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 1:
                    *(undefined1 *)((long)puVar21 + lVar26) = 0;
                    lVar26 = lVar26 + 1;
                  case 0:
                    local_38 = local_38 >> 3;
                    uVar15 = uVar15 - 3;
                    *(undefined2 *)((long)puVar21 + lVar26) = 0;
                    *(undefined1 *)((long)puVar21 + lVar26 + 2) = 0;
                  }
                }
                else {
                  if (uVar11 != 0x10) {
                    return 0;
                  }
                  if (lVar26 == 0x1278) {
                    return 0;
                  }
                  if ((uint)(iVar6 - iVar13) < (uVar20 & 3) + 3) {
                    return 0;
                  }
                  uVar4 = *(uchar *)((long)puVar24 + -1);
                  switch(uVar20 & 3) {
                  case 3:
                    lVar26 = lVar26 + 1;
                    *(uchar *)puVar24 = uVar4;
                  case 2:
                    *(uchar *)((long)puVar21 + lVar26) = uVar4;
                    lVar26 = lVar26 + 1;
                  case 1:
                    *(uchar *)((long)puVar21 + lVar26) = uVar4;
                    lVar26 = lVar26 + 1;
                  case 0:
                    local_38 = local_38 >> 2;
                    uVar15 = uVar15 - 2;
                    *(uchar *)((long)puVar21 + lVar26) = uVar4;
                    *(uchar *)((long)puVar21 + lVar26 + 1) = uVar4;
                    *(uchar *)((long)puVar21 + lVar26 + 2) = uVar4;
                  }
                }
                lVar26 = lVar26 + 3;
              }
            }
            puVar24 = (uint16_t *)((long)puVar21 + lVar26);
          } while (lVar26 < lVar3);
          if ((char)puVar21[0x9bc] == '\0') {
            return 0;
          }
          iVar6 = elf_zlib_inflate_table((uchar *)codes,uVar14,puVar21,puVar21);
          if (iVar6 == 0) {
            return 0;
          }
          iVar6 = elf_zlib_inflate_table(codes_00,uVar8,stack0xffffffffffffffb0,table);
          zdebug_table = stack0xffffffffffffffb0;
          puVar24 = stack0xffffffffffffffb0;
          puVar21 = table;
          if (iVar6 == 0) {
            return 0;
          }
          break;
        case 3:
          goto switchD_0012b75d_caseD_3;
        }
        while( true ) {
          while( true ) {
            if (uVar15 < 0xf) {
              if ((long)puVar1 - (long)puVar19 < 4) {
                return 0;
              }
              local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
              uVar15 = uVar15 | 0x20;
              puVar19 = puVar19 + 1;
            }
            uVar5 = puVar24[local_38 & 0xff];
            uVar22 = uVar5 >> 9 & 7;
            uVar17 = uVar5 & 0x1ff;
            uVar8 = (ulong)uVar17;
            if ((uVar5 >> 0xc & 1) == 0) {
              uVar22 = uVar22 + 1;
            }
            else {
              uVar17 = puVar24[uVar8 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar22)) + 0x100] &
                       0x1ff;
              uVar22 = puVar24[uVar8 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar22)) + 0x100] >>
                       9 & 7 | 8;
            }
            uVar20 = uVar15 - uVar22;
            local_38 = local_38 >> (sbyte)uVar22;
            if (0xff < uVar17) break;
            if (__s == puVar2) {
              return 0;
            }
            *__s = (uchar)uVar17;
            __s = __s + 1;
            uVar15 = uVar20;
          }
          puVar7 = puVar19;
          if (uVar17 == 0x100) break;
          if (uVar17 < 0x109) {
            uVar22 = uVar17 - 0xfe;
          }
          else {
            uVar22 = 0x102;
            if (uVar17 != 0x11d) {
              if (0x11d < uVar17) {
                return 0;
              }
              if (uVar20 < 0xf) {
                if ((long)puVar1 - (long)puVar19 < 4) {
                  return 0;
                }
                local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar20 & 0x3f);
                uVar20 = uVar20 | 0x20;
                puVar19 = puVar19 + 1;
              }
              uVar15 = uVar17 - 0x109 >> 2;
              iVar6 = uVar15 + 1;
              bVar9 = (byte)iVar6;
              bVar10 = (byte)uVar15;
              uVar22 = ((uint)local_38 & (2 << (bVar10 & 0x1f)) - 1U) +
                       ((uVar17 - 0x109 & 3) << (bVar9 & 0x1f)) + ~(-1 << (bVar10 & 0x1f)) * 8 + 0xb
              ;
              local_38 = local_38 >> (bVar9 & 0x3f);
              uVar20 = uVar20 - iVar6;
            }
          }
          if (uVar20 < 0xf) {
            if ((long)puVar1 - (long)puVar19 < 4) {
              return 0;
            }
            local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar20 & 0x3f);
            uVar20 = uVar20 | 0x20;
            puVar19 = puVar19 + 1;
          }
          uVar5 = puVar21[local_38 & 0xff];
          uVar17 = uVar5 >> 9 & 7;
          uVar23 = uVar5 & 0x1ff;
          uVar8 = (ulong)uVar23;
          if ((uVar5 >> 0xc & 1) == 0) {
            uVar17 = uVar17 + 1;
          }
          else {
            uVar23 = puVar21[uVar8 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar17)) + 0x100] &
                     0x1ff;
            uVar17 = puVar21[uVar8 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar17)) + 0x100] >> 9
                     & 7 | 8;
          }
          uVar15 = uVar20 - uVar17;
          local_38 = local_38 >> (sbyte)uVar17;
          iVar6 = (int)__s;
          if (uVar23 == 0) {
            if (__s == pout) {
              return 0;
            }
            if ((uint)(iVar12 - iVar6) < uVar22) {
              return 0;
            }
            memset(__s,(uint)__s[-1],(ulong)uVar22);
            __s = __s + uVar22;
            zdebug_table = stack0xffffffffffffffb0;
          }
          else {
            if (0x1d < uVar23) {
              return 0;
            }
            if (uVar23 < 4) {
              uVar23 = uVar23 + 1;
            }
            else {
              if (uVar15 < 0xf) {
                if ((long)puVar1 - (long)puVar19 < 4) {
                  return 0;
                }
                local_38 = local_38 | (ulong)*puVar19 << ((byte)uVar15 & 0x3f);
                uVar15 = uVar15 | 0x20;
                puVar19 = puVar19 + 1;
              }
              uVar20 = uVar23 - 4 >> 1;
              iVar13 = uVar20 + 1;
              bVar9 = (byte)iVar13;
              bVar10 = (byte)uVar20;
              uVar23 = ((uint)local_38 & (2 << (bVar10 & 0x1f)) - 1U) +
                       ((uVar23 & 1) << (bVar9 & 0x1f)) + ~(-1 << (bVar10 & 0x1f)) * 4 + 5;
              local_38 = local_38 >> (bVar9 & 0x3f);
              uVar15 = uVar15 - iVar13;
            }
            local_90 = (int)pout;
            if ((uint)(iVar6 - local_90) < uVar23) {
              return 0;
            }
            if ((uint)(iVar12 - iVar6) < uVar22) {
              return 0;
            }
            if (uVar23 < uVar22) {
              do {
                uVar20 = uVar23;
                if (uVar22 < uVar23) {
                  uVar20 = uVar22;
                }
                memcpy(__s,__s + -(ulong)uVar23,(ulong)uVar20);
                __s = __s + uVar20;
                uVar22 = uVar22 - uVar20;
                zdebug_table = stack0xffffffffffffffb0;
              } while (uVar22 != 0);
            }
            else {
              memcpy(__s,__s + -(ulong)uVar23,(ulong)uVar22);
              __s = __s + uVar22;
              zdebug_table = stack0xffffffffffffffb0;
            }
          }
        }
LAB_0012bac1:
      } while ((uVar25 & 1) == 0);
      pin = (uchar *)puVar7;
    } while (4 < (long)puVar1 - (long)puVar7);
  }
  if (__s == puVar2) {
    elf_zlib_inflate_and_verify_cold_1();
    local_3c = (int)uStack_68;
  }
  else {
LAB_0012c17c:
    local_3c = 0;
  }
switchD_0012b75d_caseD_3:
  return local_3c;
}

Assistant:

static int
elf_zlib_inflate_and_verify (const unsigned char *pin, size_t sin,
			     uint16_t *zdebug_table, unsigned char *pout,
			     size_t sout)
{
  if (!elf_zlib_inflate (pin, sin, zdebug_table, pout, sout))
    return 0;
  if (!elf_zlib_verify_checksum (pin + sin - 4, pout, sout))
    return 0;
  return 1;
}